

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O3

void __thiscall OpenMD::ForceField::parse(ForceField *this,string *filename)

{
  ifstrstream *input;
  ulong uVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  AtomType *this_00;
  uint uVar4;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_40;
  
  input = openForceFieldFile(this,filename);
  SectionParserManager::parse
            (&this->spMan_,&input->super_basic_istream<char,_std::char_traits<char>_>,this);
  p_Var2 = (this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var3) &&
     (this_00 = *(AtomType **)(p_Var2 + 2), this_00 != (AtomType *)0x0)) {
    do {
      AtomType::allYourBase(&local_40,this_00);
      uVar1 = (long)local_40.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_40.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      if (1 < uVar1) {
        uVar1 = uVar1 & 0xffffffff;
        while( true ) {
          uVar4 = (uint)(uVar1 - 1);
          if ((int)uVar4 < 1) break;
          (*local_40.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar1 - 2]->_vptr_AtomType[2])
                    (local_40.
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar1 - 2],
                     local_40.
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar4 & 0x7fffffff]);
          uVar1 = uVar1 - 1;
        }
      }
      if (local_40.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (((_Rb_tree_header *)p_Var2 != p_Var3) &&
            (this_00 = *(AtomType **)(p_Var2 + 2), this_00 != (AtomType *)0x0));
  }
  (*(input->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])(input);
  return;
}

Assistant:

void ForceField::parse(const std::string& filename) {
    ifstrstream* ffStream;

    ffStream = openForceFieldFile(filename);

    spMan_.parse(*ffStream, *this);

    ForceField::AtomTypeContainer::MapTypeIterator i;
    AtomType* at;

    for (at = atomTypeCont_.beginType(i); at != NULL;
         at = atomTypeCont_.nextType(i)) {
      // useBase sets the responsibilities, and these have to be done
      // after the atomTypes and Base types have all been scanned:

      std::vector<AtomType*> ayb = at->allYourBase();
      if (ayb.size() > 1) {
        for (int j = ayb.size() - 1; j > 0; j--) {
          ayb[j - 1]->useBase(ayb[j]);
        }
      }
    }

    delete ffStream;
  }